

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O0

void __thiscall cmCursesMainForm::RePost(cmCursesMainForm *this)

{
  bool bVar1;
  size_type sVar2;
  pointer pcVar3;
  cmState *pcVar4;
  char *pcVar5;
  pointer pcVar6;
  pointer pcVar7;
  pointer pcVar8;
  value_type local_168;
  allocator<char> local_159;
  string local_158;
  allocator<char> local_131;
  string local_130;
  byte local_10a;
  allocator<char> local_109;
  undefined1 local_108 [6];
  bool advanced_1;
  cmValue local_e8;
  cmValue existingValue_1;
  cmCursesCacheEntryComposite *entry_1;
  iterator __end1;
  iterator __begin1;
  vector<cmCursesCacheEntryComposite,_std::allocator<cmCursesCacheEntryComposite>_> *__range1;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  byte local_6d;
  bool advanced;
  allocator<char> local_59;
  string local_58;
  cmValue local_38;
  cmValue existingValue;
  cmCursesCacheEntryComposite *entry;
  iterator __end2;
  iterator __begin2;
  vector<cmCursesCacheEntryComposite,_std::allocator<cmCursesCacheEntryComposite>_> *__range2;
  cmCursesMainForm *this_local;
  
  if ((this->super_cmCursesForm).Form != (FORM *)0x0) {
    unpost_form((this->super_cmCursesForm).Form);
    free_form((this->super_cmCursesForm).Form);
    (this->super_cmCursesForm).Form = (FORM *)0x0;
  }
  std::vector<fieldnode_*,_std::allocator<fieldnode_*>_>::clear(&this->Fields);
  if ((this->AdvancedMode & 1U) == 0) {
    this->NumberOfVisibleEntries = 0;
    __end2 = std::vector<cmCursesCacheEntryComposite,_std::allocator<cmCursesCacheEntryComposite>_>
             ::begin(&this->Entries);
    entry = (cmCursesCacheEntryComposite *)
            std::vector<cmCursesCacheEntryComposite,_std::allocator<cmCursesCacheEntryComposite>_>::
            end(&this->Entries);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<cmCursesCacheEntryComposite_*,_std::vector<cmCursesCacheEntryComposite,_std::allocator<cmCursesCacheEntryComposite>_>_>
                                       *)&entry), bVar1) {
      existingValue.Value =
           (string *)
           __gnu_cxx::
           __normal_iterator<cmCursesCacheEntryComposite_*,_std::vector<cmCursesCacheEntryComposite,_std::allocator<cmCursesCacheEntryComposite>_>_>
           ::operator*(&__end2);
      pcVar3 = std::unique_ptr<cmake,_std::default_delete<cmake>_>::operator->(&this->CMakeInstance)
      ;
      pcVar4 = cmake::GetState(pcVar3);
      pcVar5 = cmCursesCacheEntryComposite::GetValue
                         ((cmCursesCacheEntryComposite *)existingValue.Value);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,pcVar5,&local_59);
      local_38 = cmState::GetCacheEntryValue(pcVar4,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      std::allocator<char>::~allocator(&local_59);
      pcVar3 = std::unique_ptr<cmake,_std::default_delete<cmake>_>::operator->(&this->CMakeInstance)
      ;
      pcVar4 = cmake::GetState(pcVar3);
      pcVar5 = cmCursesCacheEntryComposite::GetValue
                         ((cmCursesCacheEntryComposite *)existingValue.Value);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,pcVar5,&local_91);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"ADVANCED",(allocator<char> *)((long)&__range1 + 7));
      bVar1 = cmState::GetCacheEntryPropertyAsBool(pcVar4,&local_90,&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
      std::__cxx11::string::~string((string *)&local_90);
      std::allocator<char>::~allocator(&local_91);
      local_6d = bVar1;
      bVar1 = cmValue::operator_cast_to_bool(&local_38);
      if ((bVar1) && (((this->AdvancedMode & 1U) != 0 || ((local_6d & 1) == 0)))) {
        this->NumberOfVisibleEntries = this->NumberOfVisibleEntries + 1;
      }
      __gnu_cxx::
      __normal_iterator<cmCursesCacheEntryComposite_*,_std::vector<cmCursesCacheEntryComposite,_std::allocator<cmCursesCacheEntryComposite>_>_>
      ::operator++(&__end2);
    }
  }
  else {
    sVar2 = std::vector<cmCursesCacheEntryComposite,_std::allocator<cmCursesCacheEntryComposite>_>::
            size(&this->Entries);
    this->NumberOfVisibleEntries = sVar2;
  }
  if (this->NumberOfVisibleEntries == 0) {
    this->NumberOfVisibleEntries = 1;
  }
  std::vector<fieldnode_*,_std::allocator<fieldnode_*>_>::reserve
            (&this->Fields,this->NumberOfVisibleEntries * 3 + 1);
  __end1 = std::vector<cmCursesCacheEntryComposite,_std::allocator<cmCursesCacheEntryComposite>_>::
           begin(&this->Entries);
  entry_1 = (cmCursesCacheEntryComposite *)
            std::vector<cmCursesCacheEntryComposite,_std::allocator<cmCursesCacheEntryComposite>_>::
            end(&this->Entries);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<cmCursesCacheEntryComposite_*,_std::vector<cmCursesCacheEntryComposite,_std::allocator<cmCursesCacheEntryComposite>_>_>
                                     *)&entry_1), bVar1) {
    existingValue_1.Value =
         (string *)
         __gnu_cxx::
         __normal_iterator<cmCursesCacheEntryComposite_*,_std::vector<cmCursesCacheEntryComposite,_std::allocator<cmCursesCacheEntryComposite>_>_>
         ::operator*(&__end1);
    pcVar3 = std::unique_ptr<cmake,_std::default_delete<cmake>_>::operator->(&this->CMakeInstance);
    pcVar4 = cmake::GetState(pcVar3);
    pcVar5 = cmCursesCacheEntryComposite::GetValue
                       ((cmCursesCacheEntryComposite *)existingValue_1.Value);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_108,pcVar5,&local_109);
    local_e8 = cmState::GetCacheEntryValue(pcVar4,(string *)local_108);
    std::__cxx11::string::~string((string *)local_108);
    std::allocator<char>::~allocator(&local_109);
    pcVar3 = std::unique_ptr<cmake,_std::default_delete<cmake>_>::operator->(&this->CMakeInstance);
    pcVar4 = cmake::GetState(pcVar3);
    pcVar5 = cmCursesCacheEntryComposite::GetValue
                       ((cmCursesCacheEntryComposite *)existingValue_1.Value);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,pcVar5,&local_131);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"ADVANCED",&local_159);
    bVar1 = cmState::GetCacheEntryPropertyAsBool(pcVar4,&local_130,&local_158);
    std::__cxx11::string::~string((string *)&local_158);
    std::allocator<char>::~allocator(&local_159);
    std::__cxx11::string::~string((string *)&local_130);
    std::allocator<char>::~allocator(&local_131);
    local_10a = bVar1;
    bVar1 = cmValue::operator_cast_to_bool(&local_e8);
    if ((bVar1) && (((this->AdvancedMode & 1U) != 0 || ((local_10a & 1) == 0)))) {
      pcVar7 = std::unique_ptr<cmCursesLabelWidget,_std::default_delete<cmCursesLabelWidget>_>::
               operator->((unique_ptr<cmCursesLabelWidget,_std::default_delete<cmCursesLabelWidget>_>
                           *)existingValue_1.Value);
      std::vector<fieldnode_*,_std::allocator<fieldnode_*>_>::push_back
                (&this->Fields,&(pcVar7->super_cmCursesWidget).Field);
      pcVar7 = std::unique_ptr<cmCursesLabelWidget,_std::default_delete<cmCursesLabelWidget>_>::
               operator->((unique_ptr<cmCursesLabelWidget,_std::default_delete<cmCursesLabelWidget>_>
                           *)&(existingValue_1.Value)->_M_string_length);
      std::vector<fieldnode_*,_std::allocator<fieldnode_*>_>::push_back
                (&this->Fields,&(pcVar7->super_cmCursesWidget).Field);
      pcVar8 = std::unique_ptr<cmCursesWidget,_std::default_delete<cmCursesWidget>_>::operator->
                         ((unique_ptr<cmCursesWidget,_std::default_delete<cmCursesWidget>_> *)
                          &((existingValue_1.Value)->field_2)._M_allocated_capacity);
      std::vector<fieldnode_*,_std::allocator<fieldnode_*>_>::push_back
                (&this->Fields,&pcVar8->Field);
    }
    __gnu_cxx::
    __normal_iterator<cmCursesCacheEntryComposite_*,_std::vector<cmCursesCacheEntryComposite,_std::allocator<cmCursesCacheEntryComposite>_>_>
    ::operator++(&__end1);
  }
  bVar1 = std::vector<fieldnode_*,_std::allocator<fieldnode_*>_>::empty(&this->Fields);
  this->IsEmpty = bVar1;
  if ((this->IsEmpty & 1U) != 0) {
    pcVar6 = std::
             unique_ptr<cmCursesCacheEntryComposite,_std::default_delete<cmCursesCacheEntryComposite>_>
             ::operator->(&this->EmptyCacheEntry);
    pcVar7 = std::unique_ptr<cmCursesLabelWidget,_std::default_delete<cmCursesLabelWidget>_>::
             operator->(&pcVar6->Label);
    std::vector<fieldnode_*,_std::allocator<fieldnode_*>_>::push_back
              (&this->Fields,&(pcVar7->super_cmCursesWidget).Field);
    pcVar6 = std::
             unique_ptr<cmCursesCacheEntryComposite,_std::default_delete<cmCursesCacheEntryComposite>_>
             ::operator->(&this->EmptyCacheEntry);
    pcVar7 = std::unique_ptr<cmCursesLabelWidget,_std::default_delete<cmCursesLabelWidget>_>::
             operator->(&pcVar6->IsNewLabel);
    std::vector<fieldnode_*,_std::allocator<fieldnode_*>_>::push_back
              (&this->Fields,&(pcVar7->super_cmCursesWidget).Field);
    pcVar6 = std::
             unique_ptr<cmCursesCacheEntryComposite,_std::default_delete<cmCursesCacheEntryComposite>_>
             ::operator->(&this->EmptyCacheEntry);
    pcVar8 = std::unique_ptr<cmCursesWidget,_std::default_delete<cmCursesWidget>_>::operator->
                       (&pcVar6->Entry);
    std::vector<fieldnode_*,_std::allocator<fieldnode_*>_>::push_back(&this->Fields,&pcVar8->Field);
    this->NumberOfVisibleEntries = 1;
  }
  local_168 = (value_type)0x0;
  std::vector<fieldnode_*,_std::allocator<fieldnode_*>_>::push_back(&this->Fields,&local_168);
  return;
}

Assistant:

void cmCursesMainForm::RePost()
{
  // Create the fields to be passed to the form.
  if (this->Form) {
    unpost_form(this->Form);
    free_form(this->Form);
    this->Form = nullptr;
  }
  this->Fields.clear();
  if (this->AdvancedMode) {
    this->NumberOfVisibleEntries = this->Entries.size();
  } else {
    // If normal mode, count only non-advanced entries
    this->NumberOfVisibleEntries = 0;
    for (cmCursesCacheEntryComposite& entry : this->Entries) {
      cmValue existingValue =
        this->CMakeInstance->GetState()->GetCacheEntryValue(entry.GetValue());
      bool advanced =
        this->CMakeInstance->GetState()->GetCacheEntryPropertyAsBool(
          entry.GetValue(), "ADVANCED");
      if (!existingValue || (!this->AdvancedMode && advanced)) {
        continue;
      }
      this->NumberOfVisibleEntries++;
    }
  }
  // there is always one even if it is the dummy one
  if (this->NumberOfVisibleEntries == 0) {
    this->NumberOfVisibleEntries = 1;
  }
  // Assign the fields: 3 for each entry: label, new entry marker
  // ('*' or ' ') and entry widget
  this->Fields.reserve(3 * this->NumberOfVisibleEntries + 1);

  // Assign fields
  for (cmCursesCacheEntryComposite& entry : this->Entries) {
    cmValue existingValue =
      this->CMakeInstance->GetState()->GetCacheEntryValue(entry.GetValue());
    bool advanced =
      this->CMakeInstance->GetState()->GetCacheEntryPropertyAsBool(
        entry.GetValue(), "ADVANCED");
    if (!existingValue || (!this->AdvancedMode && advanced)) {
      continue;
    }
    this->Fields.push_back(entry.Label->Field);
    this->Fields.push_back(entry.IsNewLabel->Field);
    this->Fields.push_back(entry.Entry->Field);
  }
  // if no cache entries there should still be one dummy field
  this->IsEmpty = this->Fields.empty();
  if (this->IsEmpty) {
    this->Fields.push_back(this->EmptyCacheEntry->Label->Field);
    this->Fields.push_back(this->EmptyCacheEntry->IsNewLabel->Field);
    this->Fields.push_back(this->EmptyCacheEntry->Entry->Field);
    this->NumberOfVisibleEntries = 1;
  }
  // Has to be null terminated.
  this->Fields.push_back(nullptr);
}